

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_dquo
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  size_t *psVar1;
  ulong uVar2;
  char cVar3;
  code *pcVar4;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong start;
  ro_substr chars;
  basic_substring<const_char> local_60;
  basic_substring<const_char> local_50;
  long local_40;
  size_t local_38;
  
  local_60.len = s.len;
  local_60.str = s.str;
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream);
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  if (local_60.len == 0) {
    uVar9 = 0;
  }
  else {
    local_40 = ilevel + 1;
    uVar9 = 0;
    start = 0;
    local_38 = ilevel;
    do {
      cVar3 = local_60.str[start];
      if ((cVar3 == '\\') || (cVar3 == '\"')) {
        if (local_60.len < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (start < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (local_60.len < start) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,local_60.str + uVar9,start - uVar9);
        sVar7 = local_50.len;
        if (local_50.str != (char *)0x0 && local_50.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_50.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar7;
        }
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
LAB_001e3763:
        uVar9 = start + 1;
      }
      else if (local_60.str[start] == '\n') {
        if (local_60.len < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar2 = start + 1;
        uVar8 = uVar2;
        if (uVar2 == 0xffffffffffffffff) {
          uVar8 = local_60.len;
        }
        if (uVar8 < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (local_60.len < uVar8) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,local_60.str + uVar9,uVar8 - uVar9);
        sVar7 = local_50.len;
        if (local_50.str != (char *)0x0 && local_50.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_50.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar7;
        }
        bVar5 = local_38 != 0xffffffffffffffff;
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        lVar10 = local_40;
        if (uVar2 < local_60.len && bVar5) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        uVar9 = uVar2;
        if ((uVar2 < local_60.len) &&
           ((local_60.str[uVar2] == ' ' || (local_60.str[uVar2] == '\t')))) {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
        }
      }
      else if ((cVar3 == '\t') || (cVar3 == ' ')) {
        chars.len = 3;
        chars.str = " \t\r";
        sVar7 = basic_substring<const_char>::first_not_of(&local_60,chars,start);
        if (sVar7 != 0xffffffffffffffff) {
          if (local_60.len <= sVar7) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
            handle_error(0x24a7ca,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          if (local_60.str[sVar7] == '\n') {
            if (local_60.len < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x24a7ca,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (start < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x24a7ca,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_60.len < start) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x24a7ca,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_50,local_60.str + uVar9,start - uVar9);
            sVar7 = local_50.len;
            if (local_50.str != (char *)0x0 && local_50.len != 0) {
              std::ostream::write((char *)(this->
                                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ).m_stream,(long)local_50.str);
              psVar1 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar1 = *psVar1 + sVar7;
            }
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            uVar9 = start;
          }
        }
      }
      else if (cVar3 == '\r') {
        if (local_60.len < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (start < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (local_60.len < start) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,local_60.str + uVar9,start - uVar9);
        sVar7 = local_50.len;
        if (local_50.str != (char *)0x0 && local_50.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_50.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar7;
        }
        std::ostream::write((char *)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream,0x248618);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 2;
        goto LAB_001e3763;
      }
      start = start + 1;
    } while (start < local_60.len);
  }
  if ((uVar9 < local_60.len) &&
     (basic_substring<const_char>::basic_substring
                (&local_50,local_60.str + uVar9,local_60.len - uVar9),
     local_50.str != (char *)0x0 && local_50.len != 0)) {
    std::ostream::write((char *)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream,(long)local_50.str);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + local_50.len;
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream);
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_dquo(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    this->Writer::_do_write('"');
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '"' || curr == '\\')
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write('\\'); // write the escape
            this->Writer::_do_write(curr); // write the char
            pos = i+1;
        }
        else if(s[i] == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
            if(i+1 < s.len) // escape leading whitespace after the newline
            {
                const char next = s.str[i+1];
                if(next == ' ' || next == '\t')
                    this->Writer::_do_write('\\');
            }
        }
        else if(curr == ' ' || curr == '\t')
        {
            // escape trailing whitespace before a newline
            size_t next = s.first_not_of(" \t\r", i);
            if(next != npos && s[next] == '\n')
            {
                csubstr sub = s.range(pos, i);
                this->Writer::_do_write(sub);  // write everything up to (excluding) this char
                this->Writer::_do_write('\\'); // escape the whitespace
                pos = i;
            }
        }
        else if(C4_UNLIKELY(curr == '\r'))
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write("\\r"); // write the escaped char
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
    this->Writer::_do_write('"');
}